

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_audio_buffer_ref__data_source_on_read
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_uint64 mVar1;
  ma_result mVar2;
  
  mVar1 = ma_audio_buffer_ref_read_pcm_frames
                    ((ma_audio_buffer_ref *)pDataSource,pFramesOut,frameCount,0);
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = mVar1;
  }
  mVar2 = MA_SUCCESS;
  if (mVar1 == 0) {
    mVar2 = MA_AT_END;
  }
  if (mVar1 < frameCount) {
    mVar2 = MA_AT_END;
  }
  return mVar2;
}

Assistant:

static ma_result ma_audio_buffer_ref__data_source_on_read(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_audio_buffer_ref* pAudioBufferRef = (ma_audio_buffer_ref*)pDataSource;
    ma_uint64 framesRead = ma_audio_buffer_ref_read_pcm_frames(pAudioBufferRef, pFramesOut, frameCount, MA_FALSE);

    if (pFramesRead != NULL) {
        *pFramesRead = framesRead;
    }

    if (framesRead < frameCount || framesRead == 0) {
        return MA_AT_END;
    }

    return MA_SUCCESS;
}